

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chnsecal.cpp
# Opt level: O2

void __thiscall
icu_63::ChineseCalendar::ChineseCalendar(ChineseCalendar *this,Locale *aLocale,UErrorCode *success)

{
  TimeZone *pTVar1;
  ChineseCalendar *this_00;
  UDate millis;
  
  pTVar1 = TimeZone::createDefault();
  this_00 = this;
  Calendar::Calendar(&this->super_Calendar,pTVar1,aLocale,success);
  (this->super_Calendar).super_UObject._vptr_UObject = (_func_int **)&PTR__ChineseCalendar_003c5168;
  (this->super_Calendar).field_0x262 = 0;
  *(undefined4 *)&(this->super_Calendar).field_0x264 = 0xfffff5b4;
  pTVar1 = getChineseCalZoneAstroCalc(this_00);
  this->fZoneAstroCalc = pTVar1;
  millis = Calendar::getNow();
  Calendar::setTimeInMillis(&this->super_Calendar,millis,success);
  return;
}

Assistant:

ChineseCalendar::ChineseCalendar(const Locale& aLocale, UErrorCode& success)
:   Calendar(TimeZone::createDefault(), aLocale, success),
    isLeapYear(FALSE),
    fEpochYear(CHINESE_EPOCH_YEAR),
    fZoneAstroCalc(getChineseCalZoneAstroCalc())
{
    setTimeInMillis(getNow(), success); // Call this again now that the vtable is set up properly.
}